

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::
InterCellNegativelyInclinedTwoShortHLinesProducePositiveCoverAndArea(VectorRasterizerTests *this)

{
  allocator local_e9;
  cell reference [2];
  string local_c8;
  LocationInfo local_a8;
  vector_rasterizer vr;
  
  vector_rasterizer::vector_rasterizer(&vr);
  vector_rasterizer::line(&vr,0x133,0x1e6,0x180,0x2c);
  reference[0].x = 1;
  reference[0].y = 1;
  reference[0].area = -0x7f94;
  reference._8_8_ = 0x4aa400000001ff1a;
  reference[1]._6_4_ = 0xff2cffff;
  std::__cxx11::string::string
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_e9);
  ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0x352);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            (&reference,&vr._cells,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&vr);
  return;
}

Assistant:

test( InterCellNegativelyInclinedTwoShortHLinesProducePositiveCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (ctg = -713)
				vr.line(fp(1.2), fp(1.9), fp(1.5), fp(0.17)); // in fp - [(307, 486); (384, 44)), v(77, -442)

				// ASSERT
				const vector_rasterizer::cell reference[] = {
					{ 1, 1, -32660, -230 }, // dx = 40
					{ 1, 0, -46428, -212 }, // dx = 37
				};

				assert_equal(reference, vr.cells());
			}